

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTcPrsOpAdd::eval_constant(CTcPrsOpAdd *this,CTcPrsNode *left,CTcPrsNode *right)

{
  int iVar1;
  tc_constval_type_t tVar2;
  tc_constval_type_t tVar3;
  undefined4 extraout_var;
  CTcConstVal *pCVar4;
  undefined4 extraout_var_00;
  CTcGenTarg *this_00;
  CTPNListBase *this_01;
  char *__src;
  void *__dest;
  long *in_RDX;
  CTcPrsNode *in_RSI;
  size_t in_RDI;
  CTcPrsNode *unaff_retaddr;
  CTcPrsOpArith *in_stack_00000008;
  char *new_str;
  size_t len2;
  size_t len1;
  char *str2;
  char *str1;
  char buf2 [128];
  char buf1 [128];
  CTPNListEle *ele;
  CTPNList *lst;
  tc_constval_type_t typ2;
  tc_constval_type_t typ1;
  char *in_stack_fffffffffffffe88;
  CTcGenTarg *element_count;
  CTcGenTarg *in_stack_fffffffffffffe90;
  CTcPrsMem *in_stack_fffffffffffffea0;
  CTcPrsNode *in_stack_fffffffffffffea8;
  CTPNListBase *in_stack_fffffffffffffeb0;
  CTcConstVal *in_stack_fffffffffffffeb8;
  char *local_140;
  CTPNListEleBase *local_38;
  CTcPrsNode *in_stack_fffffffffffffff8;
  
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a7099);
  if ((iVar1 == 0) || (iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a70af), iVar1 == 0)) {
    in_RSI = (CTcPrsNode *)0x0;
  }
  else {
    iVar1 = (*(in_RSI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    tVar2 = CTcConstVal::get_type((CTcConstVal *)CONCAT44(extraout_var,iVar1));
    pCVar4 = (CTcConstVal *)(**(code **)(*in_RDX + 8))();
    tVar3 = CTcConstVal::get_type(pCVar4);
    if (((tVar2 == TC_CVT_INT) || (tVar2 == TC_CVT_FLOAT)) &&
       ((tVar3 == TC_CVT_INT || (tVar3 == TC_CVT_FLOAT)))) {
      in_RSI = CTcPrsOpArith::eval_constant
                         (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
    }
    else if (tVar2 == TC_CVT_LIST) {
      iVar1 = (*(in_RSI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
      this_00 = (CTcGenTarg *)
                CTcConstVal::get_val_list((CTcConstVal *)CONCAT44(extraout_var_00,iVar1));
      if (tVar3 == TC_CVT_LIST) {
        pCVar4 = (CTcConstVal *)(**(code **)(*in_RDX + 8))();
        this_01 = &CTcConstVal::get_val_list(pCVar4)->super_CTPNListBase;
        for (local_38 = &CTPNListBase::get_head(this_01)->super_CTPNListEleBase;
            local_38 != (CTPNListEleBase *)0x0;
            local_38 = &CTPNListEleBase::get_next(local_38)->super_CTPNListEleBase) {
          in_stack_fffffffffffffe90 = this_00;
          CTPNListEleBase::get_expr(local_38);
          CTPNListBase::add_element(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        }
      }
      else {
        CTPNListBase::add_element(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      }
      element_count = G_cg;
      CTPNListBase::get_count((CTPNListBase *)this_00);
      CTcGenTarg::note_list(in_stack_fffffffffffffe90,(size_t)element_count);
    }
    else if ((tVar2 == TC_CVT_SSTR) || (tVar3 == TC_CVT_SSTR)) {
      if (tVar3 == TC_CVT_LIST) {
        in_RSI = (CTcPrsNode *)0x0;
      }
      else {
        (*(in_RSI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
        local_140 = CTcConstVal::cvt_to_str
                              (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                               (size_t)in_stack_fffffffffffffea8,(size_t *)in_stack_fffffffffffffea0
                              );
        (**(code **)(*in_RDX + 8))();
        __src = CTcConstVal::cvt_to_str
                          (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                           (size_t)in_stack_fffffffffffffea8,(size_t *)in_stack_fffffffffffffea0);
        if (tVar3 == TC_CVT_NIL) {
          local_140 = "";
          in_stack_fffffffffffffea8 = (CTcPrsNode *)0x0;
        }
        if ((local_140 == (char *)0x0) || (__src == (char *)0x0)) {
          in_RSI = (CTcPrsNode *)0x0;
        }
        else {
          __dest = CTcPrsMem::alloc(in_stack_fffffffffffffea0,in_RDI);
          if (__dest == (void *)0x0) {
            in_RSI = (CTcPrsNode *)0x0;
          }
          else {
            memcpy(__dest,local_140,(size_t)in_stack_fffffffffffffeb0);
            memcpy((void *)((long)__dest + (long)in_stack_fffffffffffffeb0),__src,
                   (size_t)in_stack_fffffffffffffea8);
            *(undefined1 *)
             ((long)__dest +
             (long)&(in_stack_fffffffffffffeb0->super_CTcPrsNode).super_CTcPrsNodeBase.
                    _vptr_CTcPrsNodeBase +
             (long)&(in_stack_fffffffffffffea8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase) = 0;
            (*(in_RSI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
            CTcConstVal::set_sstr
                      ((CTcConstVal *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0x2a7393);
          }
        }
      }
    }
    else if (tVar2 == TC_CVT_OBJ) {
      in_RSI = (CTcPrsNode *)0x0;
    }
    else {
      CTcTokenizer::log_error(0x2b03);
      in_RSI = (CTcPrsNode *)0x0;
    }
  }
  return in_RSI;
}

Assistant:

CTcPrsNode *CTcPrsOpAdd::eval_constant(CTcPrsNode *left,
                                       CTcPrsNode *right) const
{
    /* check for constants */
    if (left->is_const() && right->is_const())
    {
        tc_constval_type_t typ1, typ2;

        /* get the types */
        typ1 = left->get_const_val()->get_type();
        typ2 = right->get_const_val()->get_type();
        
        /* check our types */
        if ((typ1 == TC_CVT_INT || typ1 == TC_CVT_FLOAT)
            && (typ2 == TC_CVT_INT || typ2 == TC_CVT_FLOAT))
        {
            /* int/float plus int/float - use the inherited handling */
            return CTcPrsOpArith::eval_constant(left, right);
        }
        else if (typ1 == TC_CVT_LIST)
        {
            /* get the original list */
            CTPNList *lst = left->get_const_val()->get_val_list();

            /* 
             *   if the right side is also a list, concatenate it onto the
             *   left list; otherwise, just add the right side as a new
             *   element to the existing list 
             */
            if (typ2 == TC_CVT_LIST)
            {
                CTPNListEle *ele;
                
                /* scan the list, adding each element */
                for (ele = right->get_const_val()
                           ->get_val_list()->get_head() ;
                     ele != 0 ; ele = ele->get_next())
                {
                    /* add this element's underlying expression value */
                    lst->add_element(ele->get_expr());
                }
            }
            else
            {
                /* add a new list element for the right side */
                lst->add_element(right);
            }

            /* 
             *   this list is longer than the original(s); tell the parser
             *   about it in case it's the longest list yet 
             */
            G_cg->note_list(lst->get_count());
        }
        else if (typ1 == TC_CVT_SSTR || typ2 == TC_CVT_SSTR)
        {
            char buf1[128];
            char buf2[128];
            const char *str1, *str2;
            size_t len1, len2;
            char *new_str;

            /* if the second value is a list, we can't make a constant */
            if (typ2 == TC_CVT_LIST)
                return 0;
            
            /* convert both values to strings if they're not already */
            str1 = left->get_const_val()
                   ->cvt_to_str(buf1, sizeof(buf1), &len1);
            str2 = right->get_const_val()
                   ->cvt_to_str(buf2, sizeof(buf2), &len2);

            /* treat nil as an empty string */
            if (typ2 == TC_CVT_NIL)
                str1 = "", len2 = 0;

            /* 
             *   if we couldn't convert one or the other, leave the result
             *   non-constant 
             */
            if (str1 == 0 || str2 == 0)
                return 0;
            
            /* 
             *   allocate space in the node pool for the concatenation of
             *   the two strings - if that fails, don't bother with the
             *   concatenation 
             */
            new_str = (char *)G_prsmem->alloc(len1 + len2 + 1);
            if (new_str == 0)
                return 0;

            /* copy the two string values into the new space */
            memcpy(new_str, str1, len1);
            memcpy(new_str + len1, str2, len2);
            new_str[len1 + len2] = '\0';

            /* set the new value in the left node */
            left->get_const_val()->set_sstr(new_str, len1 + len2);
        }
        else if (typ1 == TC_CVT_OBJ)
        {
            /* 
             *   assume it's an overloaded operator, in which case constant
             *   evaluation isn't possible, but it could still be a legal
             *   expression 
             */
            return 0;
        }
        else
        {
            /* these types are incompatible - log an error */
            G_tok->log_error(TCERR_CONST_BINPLUS_INCOMPAT);
            return 0;
        }

        /* return the updated left value */
        return left;
    }
    else
    {
        /* the values aren't constant, so the result isn't constant */
        return 0;
    }
}